

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superstep.hpp
# Opt level: O2

void __thiscall Superstep<int>::Superstep(Superstep<int> *this)

{
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  this->NEXT_STEP_FLAG = -2;
  this->EOC_FLAG = -1;
  (this->activitiesFunctions).
  super__Vector_base<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>,_std::allocator<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->activitiesFunctions).
  super__Vector_base<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>,_std::allocator<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->activitiesFunctions).
  super__Vector_base<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>,_std::allocator<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Barrier::Barrier(&this->startBarrier,0);
  Barrier::Barrier(&this->compPhaseBarrier,0);
  Barrier::Barrier(&this->commPhaseBarrier,0);
  *(undefined8 *)((long)&(this->atExitF).super__Function_base._M_functor + 8) = 0;
  (this->atExitF).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->outputVectorsMutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)&(this->atExitF).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->outputVectorsMutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->outputVectorsMutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->outputVectorsMutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->outputVectorsMutex).super___mutex_base._M_mutex + 8) = 0;
  (this->atExitF)._M_invoker = (_Invoker_type)0x0;
  local_40._8_8_ = 0;
  local_28 = std::
             _Function_handler<int_(std::vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dima91[P]BSP-pattern/include/superstep.hpp:110:28)>
             ::_M_invoke;
  local_30 = std::
             _Function_handler<int_(std::vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dima91[P]BSP-pattern/include/superstep.hpp:110:28)>
             ::_M_manager;
  local_40._M_unused._M_object = this;
  std::function<int_(std::vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_>_&)>::
  operator=(&this->atExitF,
            (function<int_(std::vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_>_&)>
             *)&local_40);
  std::_Function_base::~_Function_base((_Function_base *)&local_40);
  return;
}

Assistant:

Superstep<T>::Superstep () : startBarrier (0), compPhaseBarrier(0), commPhaseBarrier(0) {
	atExitF	= AtExitFunction ([&] (std::vector<LockableVector<T>> &outputItems) {
		return NEXT_STEP_FLAG;
	});
}